

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::HlslParseContext::addConstructor
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *node,TType *type)

{
  TIntermNode *node_00;
  char cVar1;
  int iVar2;
  TOperator op;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  TIntermTyped *pTVar5;
  TSourceLoc *loc_00;
  undefined4 extraout_var_01;
  long lVar6;
  undefined4 extraout_var_03;
  TIntermTyped *pTVar7;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TType *pTVar8;
  undefined8 *puVar9;
  TIntermediate *this_00;
  undefined8 *puVar10;
  TType elementType;
  TType dereferenced;
  TType local_160;
  TType local_c8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[6])(node);
  pTVar5 = (TIntermTyped *)CONCAT44(extraout_var,iVar2);
  op = TIntermediate::mapTypeToConstructorOp
                 ((this->super_TParseContextBase).super_TParseVersions.intermediate,type);
  if (op == EOpConstructTextureSampler) {
    pTVar5 = TIntermediate::setAggregateOperator
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        (TIntermNode *)pTVar5,EOpConstructTextureSampler,type,loc);
    return pTVar5;
  }
  if (op == EOpConstructStruct) {
    iVar2 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar2 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    puVar9 = *(undefined8 **)&((type->field_13).referentType)->field_0x8;
  }
  else {
    puVar9 = (undefined8 *)0x0;
  }
  TType::TType(&local_160,EbtVoid,EvqTemporary,1,0,0,false);
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  pTVar8 = type;
  if ((char)iVar2 != '\0') {
    TType::TType(&local_c8,type,0,false);
    pTVar8 = &local_c8;
  }
  TType::shallowCopy(&local_160,pTVar8);
  if ((pTVar5 != (TIntermTyped *)0x0) &&
     (*(int *)&pTVar5[1].super_TIntermNode._vptr_TIntermNode == 0)) {
    iVar2 = (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[0x32])();
    lVar6 = CONCAT44(extraout_var_02,iVar2);
    puVar10 = *(undefined8 **)(lVar6 + 8);
    if (puVar10 != *(undefined8 **)(lVar6 + 0x10)) {
      iVar2 = 1;
      do {
        iVar3 = (*type->_vptr_TType[0x1d])(type);
        node_00 = (TIntermNode *)*puVar10;
        if ((char)iVar3 == '\0') {
          if (op == EOpConstructStruct) {
            pTVar8 = (TType *)*puVar9;
            iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
            pTVar7 = constructAggregate(this,node_00,pTVar8,iVar2,
                                        (TSourceLoc *)CONCAT44(extraout_var_04,iVar3));
          }
          else {
            iVar3 = (*node_00->_vptr_TIntermNode[3])(node_00);
            iVar4 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
            pTVar7 = constructBuiltIn(this,type,op,(TIntermTyped *)CONCAT44(extraout_var_05,iVar3),
                                      (TSourceLoc *)CONCAT44(extraout_var_06,iVar4),true);
          }
        }
        else {
          iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
          pTVar7 = constructAggregate(this,node_00,&local_160,iVar2,
                                      (TSourceLoc *)CONCAT44(extraout_var_03,iVar3));
        }
        if (pTVar7 == (TIntermTyped *)0x0) {
          return (TIntermTyped *)0x0;
        }
        *puVar10 = pTVar7;
        puVar10 = puVar10 + 1;
        iVar2 = iVar2 + 1;
        puVar9 = puVar9 + 4;
      } while (puVar10 != *(undefined8 **)(lVar6 + 0x10));
    }
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    goto LAB_00381ac3;
  }
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  if (((char)iVar2 == '\0') ||
     (iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2a])(node), (char)iVar2 == '\0')) {
    iVar2 = (*type->_vptr_TType[0x1d])(type);
    if ((char)iVar2 == '\0') {
      if (op != EOpConstructStruct) {
        iVar2 = (*type->_vptr_TType[0x1c])(type);
        if ((char)iVar2 != '\0') {
          iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
          cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar2) + 200))
                            ((long *)CONCAT44(extraout_var_07,iVar2));
          if (cVar1 != '\0') {
            node = TIntermediate::addShapeConversion
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,type
                              ,node);
          }
        }
        iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
        pTVar5 = constructBuiltIn(this,type,op,node,(TSourceLoc *)CONCAT44(extraout_var_08,iVar2),
                                  false);
        goto LAB_00381a90;
      }
      pTVar8 = (TType *)*puVar9;
      iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      loc_00 = (TSourceLoc *)CONCAT44(extraout_var_01,iVar2);
    }
    else {
      iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      loc_00 = (TSourceLoc *)CONCAT44(extraout_var_00,iVar2);
      pTVar8 = &local_160;
    }
    pTVar5 = constructAggregate(this,&node->super_TIntermNode,pTVar8,1,loc_00);
  }
  else {
    pTVar5 = convertArray(this,node,type);
  }
LAB_00381a90:
  if (pTVar5 == (TIntermTyped *)0x0) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  if ((op != EOpConstructStruct) && ((char)iVar2 == '\0')) {
    return pTVar5;
  }
  this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  op = EOpConstructStruct;
LAB_00381ac3:
  pTVar5 = TIntermediate::setAggregateOperator(this_00,&pTVar5->super_TIntermNode,op,type,loc);
  return pTVar5;
}

Assistant:

TIntermTyped* HlslParseContext::addConstructor(const TSourceLoc& loc, TIntermTyped* node, const TType& type)
{
    TIntermAggregate* aggrNode = node->getAsAggregate();
    TOperator op = intermediate.mapTypeToConstructorOp(type);

    if (op == EOpConstructTextureSampler)
        return intermediate.setAggregateOperator(aggrNode, op, type, loc);

    TTypeList::const_iterator memberTypes;
    if (op == EOpConstructStruct)
        memberTypes = type.getStruct()->begin();

    TType elementType;
    if (type.isArray()) {
        TType dereferenced(type, 0);
        elementType.shallowCopy(dereferenced);
    } else
        elementType.shallowCopy(type);

    bool singleArg;
    if (aggrNode != nullptr) {
        if (aggrNode->getOp() != EOpNull)
            singleArg = true;
        else
            singleArg = false;
    } else
        singleArg = true;

    TIntermTyped *newNode;
    if (singleArg) {
        // Handle array -> array conversion
        // Constructing an array of one type from an array of another type is allowed,
        // assuming there are enough components available (semantic-checked earlier).
        if (type.isArray() && node->isArray())
            newNode = convertArray(node, type);

        // If structure constructor or array constructor is being called
        // for only one parameter inside the aggregate, we need to call constructAggregate function once.
        else if (type.isArray())
            newNode = constructAggregate(node, elementType, 1, node->getLoc());
        else if (op == EOpConstructStruct)
            newNode = constructAggregate(node, *(*memberTypes).type, 1, node->getLoc());
        else {
            // shape conversion for matrix constructor from scalar.  HLSL semantics are: scalar
            // is replicated into every element of the matrix (not just the diagnonal), so
            // that is handled specially here.
            if (type.isMatrix() && node->getType().isScalarOrVec1())
                node = intermediate.addShapeConversion(type, node);

            newNode = constructBuiltIn(type, op, node, node->getLoc(), false);
        }

        if (newNode && (type.isArray() || op == EOpConstructStruct))
            newNode = intermediate.setAggregateOperator(newNode, EOpConstructStruct, type, loc);

        return newNode;
    }

    //
    // Handle list of arguments.
    //
    TIntermSequence& sequenceVector = aggrNode->getSequence();    // Stores the information about the parameter to the constructor
    // if the structure constructor contains more than one parameter, then construct
    // each parameter

    int paramCount = 0;  // keeps a track of the constructor parameter number being checked

    // for each parameter to the constructor call, check to see if the right type is passed or convert them
    // to the right type if possible (and allowed).
    // for structure constructors, just check if the right type is passed, no conversion is allowed.

    for (TIntermSequence::iterator p = sequenceVector.begin();
        p != sequenceVector.end(); p++, paramCount++) {
        if (type.isArray())
            newNode = constructAggregate(*p, elementType, paramCount + 1, node->getLoc());
        else if (op == EOpConstructStruct)
            newNode = constructAggregate(*p, *(memberTypes[paramCount]).type, paramCount + 1, node->getLoc());
        else
            newNode = constructBuiltIn(type, op, (*p)->getAsTyped(), node->getLoc(), true);

        if (newNode)
            *p = newNode;
        else
            return nullptr;
    }

    TIntermTyped* constructor = intermediate.setAggregateOperator(aggrNode, op, type, loc);

    return constructor;
}